

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void __thiscall
cashew::ValueBuilder::appendArgumentToFunction(ValueBuilder *this,Ref func,IString arg)

{
  Value *this_00;
  char cVar1;
  Ref *this_01;
  undefined8 *puVar2;
  Ref r;
  void *__ptr;
  ValueBuilder *local_30;
  Ref func_local;
  
  local_30 = this;
  this_01 = (Ref *)cashew::Ref::operator[]((uint)&local_30);
  cVar1 = cashew::Ref::operator==(this_01,(IString *)&DEFUN);
  if (cVar1 != '\0') {
    puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&local_30);
    this_00 = (Value *)*puVar2;
    __ptr = (void *)0x18;
    r.inst = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
    (r.inst)->type = Null;
    Value::free(r.inst,__ptr);
    (r.inst)->type = String;
    ((r.inst)->field_1).ref.inst = func.inst;
    ((r.inst)->field_1).str.str._M_str = (char *)arg.str._M_len;
    Value::push_back(this_00,r);
    return;
  }
  __assert_fail("func[0] == DEFUN",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x67d,"static void cashew::ValueBuilder::appendArgumentToFunction(Ref, IString)");
}

Assistant:

static void appendArgumentToFunction(Ref func, IString arg) {
    assert(func[0] == DEFUN);
    func[2]->push_back(makeRawString(arg));
  }